

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

int __thiscall
SocketInternals::Recv(SocketInternals *this,uchar *bufrecv,size_t maxlen,double timeoutSec)

{
  long lVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  ssize_t sVar5;
  void *this_00;
  double dVar6;
  uchar *local_5a0;
  iovec vec;
  sockaddr_storage addrRemote;
  MsgHeaderType hdr;
  char controldata [1000];
  size_t CONTROL_DATA_SIZE;
  undefined1 auStack_e0 [4];
  int retval;
  timeval timeout;
  int nfds;
  suseconds_t usec;
  time_t sec;
  fd_set *__arr;
  undefined1 local_a8 [4];
  uint __i;
  fd_set readfds;
  double timeoutSec_local;
  size_t maxlen_local;
  uchar *bufrecv_local;
  SocketInternals *this_local;
  
  readfds.fds_bits[0xf] = (__fd_mask)timeoutSec;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    readfds.fds_bits[(ulong)__arr._4_4_ - 1] = 0;
  }
  lVar1 = (long)(this->SocketFD / 0x40);
  readfds.fds_bits[lVar1 + -1] =
       1L << ((byte)((long)this->SocketFD % 0x40) & 0x3f) | readfds.fds_bits[lVar1 + -1];
  dVar6 = floor((double)readfds.fds_bits[0xf]);
  _auStack_e0 = (long)dVar6;
  timeout.tv_sec = (__time_t)(((double)readfds.fds_bits[0xf] - (double)_auStack_e0) * 1000000.0);
  timeout.tv_usec._4_4_ = this->SocketFD + 1;
  CONTROL_DATA_SIZE._4_4_ =
       select(timeout.tv_usec._4_4_,(fd_set *)local_a8,(fd_set *)0x0,(fd_set *)0x0,
              (timeval *)auStack_e0);
  if (CONTROL_DATA_SIZE._4_4_ == -1) {
    poVar2 = std::operator<<(this->outStr,"Recv: select failed: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (0 < CONTROL_DATA_SIZE._4_4_) {
    if ((this->FirstRun & 1U) == 0) {
      sVar5 = recv(this->SocketFD,bufrecv,maxlen,0);
      CONTROL_DATA_SIZE._4_4_ = (int)sVar5;
    }
    else {
      addrRemote.__ss_align = (unsigned_long)&vec.iov_len;
      hdr.msg_name._0_4_ = 0x80;
      hdr._8_8_ = &local_5a0;
      hdr.msg_iov = (iovec *)0x1;
      hdr.msg_iovlen = (size_t)&hdr.msg_flags;
      hdr.msg_control = (void *)0x3e8;
      local_5a0 = bufrecv;
      vec.iov_base = (void *)maxlen;
      sVar5 = recvmsg(this->SocketFD,(msghdr *)&addrRemote.__ss_align,0);
      CONTROL_DATA_SIZE._4_4_ = (int)sVar5;
      ExtractInterfaceInfo(this,(MsgHeaderType *)&addrRemote.__ss_align);
      poVar2 = std::operator<<(this->outStr,"Using interface ");
      poVar2 = std::operator<<(poVar2,(string *)&this->InterfaceName);
      poVar2 = std::operator<<(poVar2," (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->InterfaceIndex);
      poVar2 = std::operator<<(poVar2,"), MTU: ");
      this_00 = (void *)std::ostream::operator<<(poVar2,this->InterfaceMTU);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this->FirstRun = false;
    }
    if (CONTROL_DATA_SIZE._4_4_ == -1) {
      poVar2 = std::operator<<(this->outStr,"Recv: failed to receive: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return CONTROL_DATA_SIZE._4_4_;
}

Assistant:

int SocketInternals::Recv(unsigned char *bufrecv, size_t maxlen, const double timeoutSec)
{
    fd_set readfds;
    FD_ZERO(&readfds);
    FD_SET(SocketFD, &readfds);

#ifdef _MSC_VER
    long sec = static_cast<long>(floor(timeoutSec));
    long usec = static_cast<long>((timeoutSec - sec) * 1e6);
    int nfds = 1;   // On Windows, this parameter to select is ignored
#else
    time_t sec = static_cast<time_t>(floor(timeoutSec));
    suseconds_t usec = static_cast<suseconds_t>((timeoutSec - sec) * 1e6);
    int nfds = SocketFD+1;
#endif
    timeval timeout = { sec , usec };
    int retval = select(nfds, &readfds, NULL, NULL, &timeout);

    // It is o.k. to check against SOCKET_ERROR. On Windows, this is correct.
    // On Linux, we should check for -1 (which is how SOCKET_ERROR is defined above).
    if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
        outStr << "Recv: select failed: " << WSAGetLastError() << std::endl;
#else
        outStr << "Recv: select failed: " << strerror(errno) << std::endl;
#endif
    }
    else if (retval > 0) {

        if (FirstRun) {

            const size_t CONTROL_DATA_SIZE = 1000;  // THIS NEEDS TO BE BIG ENOUGH.
            char controldata[CONTROL_DATA_SIZE];
            MsgHeaderType hdr;

#ifdef _MSC_VER
            SOCKADDR addrRemote;
            GUID WSARecvMsg_GUID = WSAID_WSARECVMSG;
            LPFN_WSARECVMSG WSARecvMsg;
            DWORD nBytes;
            retval = WSAIoctl(SocketFD, SIO_GET_EXTENSION_FUNCTION_POINTER, &WSARecvMsg_GUID,
                              sizeof(WSARecvMsg_GUID), &WSARecvMsg, sizeof(WSARecvMsg), &nBytes,
                              NULL, NULL);
            if (retval == SOCKET_ERROR) {
                outStr << "Recv: could not get WSARecvMsg function pointer" << std::endl;
            }
            else {
                WSABUF WSAbuf;
                WSAbuf.buf = reinterpret_cast<char *>(bufrecv);
                WSAbuf.len = maxlen;

                hdr.name = &addrRemote;
                hdr.namelen = sizeof(addrRemote);
                hdr.lpBuffers = &WSAbuf;
                hdr.dwBufferCount = 1;
                hdr.Control.buf = controldata;
                hdr.Control.len = CONTROL_DATA_SIZE;
                hdr.dwFlags = MSG_PEEK;  // Do not remove message from queue

                retval = WSARecvMsg(SocketFD, &hdr, &nBytes, NULL, NULL);
                if (retval == SOCKET_ERROR)
                    outStr << "Recv: WSARecvMsg failed" << std::endl;
                else
                    ExtractInterfaceInfo(&hdr);
            }
            // For some reason, the call to WSARecvMsg (without MSG_PEEK flag) does
            // not work, so we instead specify MSG_PEEK above and call recv again.
            // This also handles the error case (unable to get WSARecvMsg pointer).
            retval = recv(SocketFD, reinterpret_cast<char *>(bufrecv), maxlen, 0);
#else
            sockaddr_storage addrRemote;

            struct iovec vec;
            vec.iov_base = bufrecv;
            vec.iov_len = maxlen;

            hdr.msg_name = &addrRemote;
            hdr.msg_namelen = sizeof(addrRemote);
            hdr.msg_iov = &vec;
            hdr.msg_iovlen = 1;
            hdr.msg_control = controldata;
            hdr.msg_controllen = CONTROL_DATA_SIZE;

            retval = recvmsg(SocketFD, &hdr, 0);
            ExtractInterfaceInfo(&hdr);
#endif

            outStr << "Using interface " << InterfaceName << " (" << InterfaceIndex << "), MTU: " << InterfaceMTU << std::endl;
            FirstRun = false;
        } else {
            //struct sockaddr_in fromAddr;
            //socklen_t length = sizeof(fromAddr);
            //retval = recvfrom(socketFD, bufrecv, maxlen, 0, reinterpret_cast<struct sockaddr *>(&fromAddr), &length);
            retval = recv(SocketFD, reinterpret_cast<char *>(bufrecv), maxlen, 0);
        }
        if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
            outStr << "Recv: failed to receive: " << WSAGetLastError() << std::endl;
#else
            outStr << "Recv: failed to receive: " << strerror(errno) << std::endl;
#endif
        }
    }
    return retval;
}